

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::toggle_create_joint_action(Application *this)

{
  Scene *pSVar1;
  _Rb_tree_node_base *p_Var2;
  
  if (this->action == CreateJoint) {
    this->action = Object;
    this->isGhosted = false;
    pSVar1 = this->scene;
    for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *(undefined1 *)(*(long *)(p_Var2 + 1) + 0xe9) = 0;
    }
  }
  else {
    this->action = CreateJoint;
    this->isGhosted = true;
    pSVar1 = this->scene;
    for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *(undefined1 *)(*(long *)(p_Var2 + 1) + 0xe9) = 1;
    }
  }
  return;
}

Assistant:

void Application::toggle_create_joint_action() {
  if (action != Action::CreateJoint) {
    action = Action::CreateJoint;
    setGhosted(true);
  } else {
    action = Action::Object;
    setGhosted(false);
  }
}